

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

void __thiscall Parser::ULTRA_HIGH(Parser *this)

{
  Lex *this_00;
  Lex *pLVar1;
  lex_t lVar2;
  int iVar3;
  ostream *poVar4;
  Lex local_3c;
  
  ULTRA_ULTRA_HIGH(this);
  lVar2 = this->c_type;
  if ((lVar2 & ~LEX_AND) == LEX_TIMES) {
    this_00 = &this->c_lex;
    do {
      Lex::Lex(&local_3c,lVar2,0,0);
      std::deque<Lex,_std::allocator<Lex>_>::emplace_back<Lex>(&(this->lex_stack).c,&local_3c);
      Lex::~Lex(&local_3c);
      pLVar1 = (this->index)._M_current;
      (this->c_lex).add_value = pLVar1->add_value;
      iVar3 = pLVar1->value;
      this_00->type = pLVar1->type;
      this_00->value = iVar3;
      lVar2 = Lex::get_type(this_00);
      this->c_type = lVar2;
      iVar3 = Lex::get_value(this_00);
      this->c_val = iVar3;
      iVar3 = Lex::get_add_value(this_00);
      this->c_add_val = iVar3;
      (this->index)._M_current = (this->index)._M_current + 1;
      if (DEBUG_MODE != 0) {
        poVar4 = operator<<((ostream *)&std::cout,this_00);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
      }
      ULTRA_ULTRA_HIGH(this);
      check_op(this);
      lVar2 = this->c_type;
    } while ((lVar2 & ~LEX_AND) == LEX_TIMES);
  }
  return;
}

Assistant:

void Parser::ULTRA_HIGH() {
    ULTRA_ULTRA_HIGH();
    while ( c_type == LEX_TIMES || c_type == LEX_SLASH) {
        lex_stack.push (c_type);
        get_lex();
        ULTRA_ULTRA_HIGH();
        check_op();
    }
}